

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::convert_separate_image_to_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t id)

{
  VariableID samp_id;
  SPIRVariable *pSVar1;
  SPIRType *pSVar2;
  runtime_error *this_00;
  SPIRType sampled_type;
  _Alloc_hider in_stack_fffffffffffffe30;
  char local_1c0 [16];
  string local_1b0;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 local_170 [32];
  uint *local_150;
  size_t local_148;
  uint local_138 [8];
  bool *local_118;
  size_t local_110;
  bool local_100 [24];
  TypedID<(spirv_cross::Types)1> *local_e8;
  size_t local_e0;
  TypedID<(spirv_cross::Types)1> local_d0 [8];
  uint *local_b0;
  size_t local_a8;
  uint local_98 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  pSVar1 = Compiler::maybe_get_backing_variable(&this->super_Compiler,id);
  if ((((pSVar1 != (SPIRVariable *)0x0) &&
       (pSVar2 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                            + *(uint *)&(pSVar1->super_IVariant).field_0xc),
       *(int *)&(pSVar2->super_IVariant).field_0xc == 0x10)) && ((pSVar2->image).sampled == 1)) &&
     ((pSVar2->image).dim != DimBuffer)) {
    samp_id.id = (this->super_Compiler).dummy_sampler_id;
    if ((this->options).vulkan_semantics != true) {
      if (samp_id.id != 0) {
        to_combined_image_sampler_abi_cxx11_(__return_storage_ptr__,this,(VariableID)id,samp_id);
        return __return_storage_ptr__;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_170._0_8_ = local_170 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_170,
                 "Cannot find dummy sampler ID. Was build_dummy_sampler_for_combined_images() called?"
                 ,"");
      ::std::runtime_error::runtime_error(this_00,(string *)local_170);
      *(undefined ***)this_00 = &PTR__runtime_error_003d7e38;
      __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (samp_id.id != 0) {
      SPIRType::SPIRType((SPIRType *)local_170,pSVar2);
      local_170._12_4_ = 0x11;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_190,this,(SPIRType *)local_170,0);
      to_non_uniform_aware_expression_abi_cxx11_(&local_1b0,this,id);
      to_expression_abi_cxx11_
                ((string *)&stack0xfffffffffffffe30,this,(this->super_Compiler).dummy_sampler_id,
                 true);
      join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f5ef,
                 (char (*) [2])&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35f4cc,
                 (char (*) [3])&stack0xfffffffffffffe30,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3482a8,
                 (char (*) [2])in_stack_fffffffffffffe30._M_p);
      if ((char (*) [2])in_stack_fffffffffffffe30._M_p != (char (*) [2])local_1c0) {
        operator_delete(in_stack_fffffffffffffe30._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p);
      }
      if (local_190[0] != local_180) {
        operator_delete(local_190[0]);
      }
      local_170._0_8_ = &PTR__SPIRType_003d8230;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_58);
      local_a8 = 0;
      if (local_b0 != local_98) {
        free(local_b0);
      }
      local_e0 = 0;
      if (local_e8 != local_d0) {
        free(local_e8);
      }
      local_110 = 0;
      if (local_118 != local_100) {
        free(local_118);
      }
      local_148 = 0;
      if (local_150 == local_138) {
        return __return_storage_ptr__;
      }
      free(local_150);
      return __return_storage_ptr__;
    }
    local_170._0_8_ = local_170 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_170,"GL_EXT_samplerless_texture_functions","");
    require_extension_internal(this,(string *)local_170);
    if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
      operator_delete((void *)local_170._0_8_);
    }
  }
  to_non_uniform_aware_expression_abi_cxx11_(__return_storage_ptr__,this,id);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerGLSL::convert_separate_image_to_expression(uint32_t id)
{
	auto *var = maybe_get_backing_variable(id);

	// If we are fetching from a plain OpTypeImage, we must combine with a dummy sampler in GLSL.
	// In Vulkan GLSL, we can make use of the newer GL_EXT_samplerless_texture_functions.
	if (var)
	{
		auto &type = get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (options.vulkan_semantics)
			{
				if (dummy_sampler_id)
				{
					// Don't need to consider Shadow state since the dummy sampler is always non-shadow.
					auto sampled_type = type;
					sampled_type.basetype = SPIRType::SampledImage;
					return join(type_to_glsl(sampled_type), "(", to_non_uniform_aware_expression(id), ", ",
					            to_expression(dummy_sampler_id), ")");
				}
				else
				{
					// Newer glslang supports this extension to deal with texture2D as argument to texture functions.
					require_extension_internal("GL_EXT_samplerless_texture_functions");
				}
			}
			else
			{
				if (!dummy_sampler_id)
					SPIRV_CROSS_THROW("Cannot find dummy sampler ID. Was "
					                  "build_dummy_sampler_for_combined_images() called?");

				return to_combined_image_sampler(id, dummy_sampler_id);
			}
		}
	}

	return to_non_uniform_aware_expression(id);
}